

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_fmt_conv.c
# Opt level: O0

void ihevcd_fmt_conv_420sp_to_rgba8888
               (UWORD8 *pu1_y_src,UWORD8 *pu1_uv_src,UWORD32 *pu4_rgba_dst,WORD32 wd,WORD32 ht,
               WORD32 src_y_strd,WORD32 src_uv_strd,WORD32 dst_strd,WORD32 is_u_first)

{
  short sVar1;
  short sVar2;
  short sVar3;
  byte *pbVar4;
  int in_ECX;
  UWORD8 *in_RDX;
  uint *puVar5;
  byte *in_RSI;
  UWORD8 *in_RDI;
  int in_R8D;
  int in_R9D;
  WORD16 i2_j;
  WORD16 i2_i;
  UWORD32 u4_b;
  UWORD32 u4_g;
  UWORD32 u4_r;
  WORD16 i2_b;
  WORD16 i2_g;
  WORD16 i2_r;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  uint local_b0;
  uint local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  uint local_98;
  uint local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  byte *local_60;
  byte *local_58;
  uint *local_50;
  byte *local_48;
  short local_3c;
  short local_3a;
  UWORD8 *pu1_v_src;
  UWORD8 *pu1_u_src;
  UWORD32 *pu4_rgba_dst_NextRow;
  UWORD8 *pu1_y_src_nxt;
  
  if (_i2_g == 0) {
    local_58 = in_RSI + 1;
    local_60 = in_RSI;
  }
  else {
    local_60 = in_RSI + 1;
    local_58 = in_RSI;
  }
  local_48 = in_RDI + in_R9D;
  local_50 = (uint *)(in_RDX + (long)(int)u4_r * 4);
  pu1_u_src = in_RDX;
  pu1_y_src_nxt = in_RDI;
  for (local_3a = 0; (int)local_3a < in_R8D >> 1; local_3a = local_3a + 1) {
    for (local_3c = (short)(in_ECX >> 1); 0 < local_3c; local_3c = local_3c + -1) {
      sVar1 = (short)((int)((*local_58 - 0x80) * 0x4092) >> 0xd);
      sVar2 = (short)((int)((*local_58 - 0x80) * -0xc87 + (*local_60 - 0x80) * -0x1a08) >> 0xd);
      sVar3 = (short)((int)((*local_60 - 0x80) * 0x3311) >> 0xd);
      local_58 = local_58 + 2;
      local_60 = local_60 + 2;
      if ((int)((uint)*pu1_y_src_nxt + (int)sVar1) < 0x100) {
        if ((int)((uint)*pu1_y_src_nxt + (int)sVar1) < 0) {
          local_68 = 0;
        }
        else {
          local_68 = (uint)*pu1_y_src_nxt + (int)sVar1;
        }
        local_64 = local_68;
      }
      else {
        local_64 = 0xff;
      }
      if ((int)((uint)*pu1_y_src_nxt + (int)sVar2) < 0x100) {
        if ((int)((uint)*pu1_y_src_nxt + (int)sVar2) < 0) {
          local_70 = 0;
        }
        else {
          local_70 = (uint)*pu1_y_src_nxt + (int)sVar2;
        }
        local_6c = local_70;
      }
      else {
        local_6c = 0xff;
      }
      if ((int)((uint)*pu1_y_src_nxt + (int)sVar3) < 0x100) {
        if ((int)((uint)*pu1_y_src_nxt + (int)sVar3) < 0) {
          local_78 = 0;
        }
        else {
          local_78 = (uint)*pu1_y_src_nxt + (int)sVar3;
        }
        local_74 = local_78;
      }
      else {
        local_74 = 0xff;
      }
      pbVar4 = pu1_y_src_nxt + 1;
      puVar5 = (uint *)(pu1_u_src + 4);
      *(uint *)pu1_u_src = local_74 << 0x10 | local_6c << 8 | local_64;
      if ((int)((uint)*pbVar4 + (int)sVar1) < 0x100) {
        if ((int)((uint)*pbVar4 + (int)sVar1) < 0) {
          local_80 = 0;
        }
        else {
          local_80 = (uint)*pbVar4 + (int)sVar1;
        }
        local_7c = local_80;
      }
      else {
        local_7c = 0xff;
      }
      if ((int)((uint)*pbVar4 + (int)sVar2) < 0x100) {
        if ((int)((uint)*pbVar4 + (int)sVar2) < 0) {
          local_88 = 0;
        }
        else {
          local_88 = (uint)*pbVar4 + (int)sVar2;
        }
        local_84 = local_88;
      }
      else {
        local_84 = 0xff;
      }
      if ((int)((uint)*pbVar4 + (int)sVar3) < 0x100) {
        if ((int)((uint)*pbVar4 + (int)sVar3) < 0) {
          local_90 = 0;
        }
        else {
          local_90 = (uint)*pbVar4 + (int)sVar3;
        }
        local_8c = local_90;
      }
      else {
        local_8c = 0xff;
      }
      pu1_y_src_nxt = pu1_y_src_nxt + 2;
      pu1_u_src = pu1_u_src + 8;
      *puVar5 = local_8c << 0x10 | local_84 << 8 | local_7c;
      if ((int)((uint)*local_48 + (int)sVar1) < 0x100) {
        if ((int)((uint)*local_48 + (int)sVar1) < 0) {
          local_98 = 0;
        }
        else {
          local_98 = (uint)*local_48 + (int)sVar1;
        }
        local_94 = local_98;
      }
      else {
        local_94 = 0xff;
      }
      if ((int)((uint)*local_48 + (int)sVar2) < 0x100) {
        if ((int)((uint)*local_48 + (int)sVar2) < 0) {
          local_a0 = 0;
        }
        else {
          local_a0 = (uint)*local_48 + (int)sVar2;
        }
        local_9c = local_a0;
      }
      else {
        local_9c = 0xff;
      }
      if ((int)((uint)*local_48 + (int)sVar3) < 0x100) {
        if ((int)((uint)*local_48 + (int)sVar3) < 0) {
          local_a8 = 0;
        }
        else {
          local_a8 = (uint)*local_48 + (int)sVar3;
        }
        local_a4 = local_a8;
      }
      else {
        local_a4 = 0xff;
      }
      pbVar4 = local_48 + 1;
      puVar5 = local_50 + 1;
      *local_50 = local_a4 << 0x10 | local_9c << 8 | local_94;
      if ((int)((uint)*pbVar4 + (int)sVar1) < 0x100) {
        if ((int)((uint)*pbVar4 + (int)sVar1) < 0) {
          local_b0 = 0;
        }
        else {
          local_b0 = (uint)*pbVar4 + (int)sVar1;
        }
        local_ac = local_b0;
      }
      else {
        local_ac = 0xff;
      }
      if ((int)((uint)*pbVar4 + (int)sVar2) < 0x100) {
        if ((int)((uint)*pbVar4 + (int)sVar2) < 0) {
          local_b8 = 0;
        }
        else {
          local_b8 = (uint)*pbVar4 + (int)sVar2;
        }
        local_b4 = local_b8;
      }
      else {
        local_b4 = 0xff;
      }
      if ((int)((uint)*pbVar4 + (int)sVar3) < 0x100) {
        if ((int)((uint)*pbVar4 + (int)sVar3) < 0) {
          local_c0 = 0;
        }
        else {
          local_c0 = (uint)*pbVar4 + (int)sVar3;
        }
        local_bc = local_c0;
      }
      else {
        local_bc = 0xff;
      }
      local_48 = local_48 + 2;
      local_50 = local_50 + 2;
      *puVar5 = local_bc << 0x10 | local_b4 << 8 | local_ac;
    }
    local_58 = local_58 + ((long)(int)u4_b - (long)in_ECX);
    local_60 = local_60 + ((long)(int)u4_b - (long)in_ECX);
    pu1_y_src_nxt = pu1_y_src_nxt + ((long)(in_R9D << 1) - (long)in_ECX);
    local_48 = local_48 + ((long)(in_R9D << 1) - (long)in_ECX);
    pu1_u_src = (UWORD8 *)(local_50 + ((long)(int)u4_r - (long)in_ECX));
    local_50 = local_50 + ((long)(int)(u4_r << 1) - (long)in_ECX);
  }
  return;
}

Assistant:

void ihevcd_fmt_conv_420sp_to_rgba8888(UWORD8 *pu1_y_src,
                                       UWORD8 *pu1_uv_src,
                                       UWORD32 *pu4_rgba_dst,
                                       WORD32 wd,
                                       WORD32 ht,
                                       WORD32 src_y_strd,
                                       WORD32 src_uv_strd,
                                       WORD32 dst_strd,
                                       WORD32 is_u_first)
{


    WORD16  i2_r, i2_g, i2_b;
    UWORD32  u4_r, u4_g, u4_b;
    WORD16  i2_i, i2_j;
    UWORD8  *pu1_y_src_nxt;
    UWORD32 *pu4_rgba_dst_NextRow;

    UWORD8 *pu1_u_src, *pu1_v_src;

    if(is_u_first)
    {
        pu1_u_src = (UWORD8 *)pu1_uv_src;
        pu1_v_src = (UWORD8 *)pu1_uv_src + 1;
    }
    else
    {
        pu1_u_src = (UWORD8 *)pu1_uv_src + 1;
        pu1_v_src = (UWORD8 *)pu1_uv_src;
    }

    pu1_y_src_nxt   = pu1_y_src + src_y_strd;
    pu4_rgba_dst_NextRow = pu4_rgba_dst + dst_strd;

    for(i2_i = 0; i2_i < (ht >> 1); i2_i++)
    {
        for(i2_j = (wd >> 1); i2_j > 0; i2_j--)
        {
            i2_b = ((*pu1_u_src - 128) * COEFF4 >> 13);
            i2_g = ((*pu1_u_src - 128) * COEFF2 + (*pu1_v_src - 128) * COEFF3) >> 13;
            i2_r = ((*pu1_v_src - 128) * COEFF1) >> 13;

            pu1_u_src += 2;
            pu1_v_src += 2;
            /* pixel 0 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src + i2_r);

            pu1_y_src++;
            *pu4_rgba_dst++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

            /* pixel 1 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src + i2_r);

            pu1_y_src++;
            *pu4_rgba_dst++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

            /* pixel 2 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src_nxt + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src_nxt + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src_nxt + i2_r);

            pu1_y_src_nxt++;
            *pu4_rgba_dst_NextRow++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

            /* pixel 3 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src_nxt + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src_nxt + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src_nxt + i2_r);

            pu1_y_src_nxt++;
            *pu4_rgba_dst_NextRow++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

        }

        pu1_u_src = pu1_u_src + src_uv_strd - wd;
        pu1_v_src = pu1_v_src + src_uv_strd - wd;

        pu1_y_src = pu1_y_src + (src_y_strd << 1) - wd;
        pu1_y_src_nxt = pu1_y_src_nxt + (src_y_strd << 1) - wd;

        pu4_rgba_dst = pu4_rgba_dst_NextRow - wd + dst_strd;
        pu4_rgba_dst_NextRow = pu4_rgba_dst_NextRow + (dst_strd << 1) - wd;
    }


}